

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O1

string * __thiscall
OpenMD::Stats::getStatsReport_abi_cxx11_(string *__return_storage_ptr__,Stats *this)

{
  pointer pSVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  long lVar4;
  RealType RVar5;
  char cVar6;
  string *psVar7;
  int iVar8;
  int iVar9;
  long *plVar10;
  ostream *poVar11;
  long lVar12;
  MatrixAccumulator *this_00;
  VectorAccumulator *this_01;
  PotVecAccumulator *this_02;
  long lVar13;
  char *pcVar14;
  uint j;
  long lVar15;
  Vector3d e_2;
  Mat3x3d s;
  string rlc;
  string rex;
  string ruc;
  string llc;
  string lex;
  string luc;
  string pm;
  string head;
  Mat3x3d e;
  stringstream report;
  ResultType local_378;
  double *local_350 [2];
  double local_340;
  double local_338;
  double local_330;
  double local_328;
  double local_320;
  double local_318;
  double local_310;
  long *local_308;
  long local_300;
  long local_2f8 [2];
  long *local_2e8;
  long local_2e0;
  long local_2d8 [2];
  long *local_2c8;
  long local_2c0;
  long local_2b8 [2];
  long *local_2a8;
  long local_2a0;
  long local_298 [2];
  long *local_288;
  long local_280;
  long local_278 [2];
  long *local_268;
  long local_260;
  long local_258 [2];
  long *local_248;
  long local_240;
  long local_238 [2];
  long *local_228;
  long local_220;
  long local_218 [2];
  ResultType local_208;
  stringstream local_1c0 [16];
  long local_1b0 [2];
  undefined8 uStack_1a0;
  uint auStack_198 [22];
  ios_base local_140 [264];
  string *local_38;
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  local_248 = local_238;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_248,anon_var_dwarf_8d9093,anon_var_dwarf_8d9093 + 6);
  local_268 = local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,anon_var_dwarf_8d909f,anon_var_dwarf_8d909f + 3);
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_288,anon_var_dwarf_8d90ab,anon_var_dwarf_8d90ab + 3);
  local_2a8 = local_298;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2a8,anon_var_dwarf_8d90b7,anon_var_dwarf_8d90b7 + 3);
  local_2c8 = local_2b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c8,anon_var_dwarf_8d90c3,anon_var_dwarf_8d90c3 + 3);
  local_2e8 = local_2d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e8,anon_var_dwarf_8d90cf,anon_var_dwarf_8d90cf + 3);
  local_308 = local_2f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_308,anon_var_dwarf_8d90db,anon_var_dwarf_8d90db + 3);
  plVar10 = (long *)__dynamic_cast(((this->data_).
                                    super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->accumulator,
                                   &BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
  iVar8 = (**(code **)(*plVar10 + 8))(plVar10);
  local_228 = local_218;
  std::__cxx11::string::_M_construct((ulong)&local_228,'O');
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,(char *)local_228,local_220);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"# Status Report:",0x10);
  local_350[0] = &local_340;
  std::__cxx11::string::_M_construct((ulong)local_350,'>');
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,(char *)local_350[0],(long)local_350[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"#",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  if (local_350[0] != &local_340) {
    operator_delete(local_350[0],(long)local_340 + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"# ",2);
  *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) =
       *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) & 0xffffff4f | 0x80;
  *(undefined8 *)((long)&uStack_1a0 + *(long *)(local_1b0[0] + -0x18)) = 0x18;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"Total Time:",0xb);
  *(undefined8 *)((long)&uStack_1a0 + *(long *)(local_1b0[0] + -0x18)) = 0xc;
  lVar12 = __dynamic_cast(((this->data_).
                           super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                           ._M_impl.super__Vector_impl_data._M_start)->accumulator,
                          &BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
  std::ostream::_M_insert<double>(*(double *)(lVar12 + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0," ",1);
  *(undefined8 *)((long)&uStack_1a0 + *(long *)(local_1b0[0] + -0x18)) = 0x11;
  *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) =
       *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) & 0xffffff4f | 0x20;
  pSVar1 = (this->data_).
           super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (pSVar1->units)._M_dataplus._M_p;
  local_350[0] = &local_340;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_350,pcVar2,pcVar2 + (pSVar1->units)._M_string_length);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,(char *)local_350[0],(long)local_350[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"                      #",0x17);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  if (local_350[0] != &local_340) {
    operator_delete(local_350[0],(long)local_340 + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"# ",2);
  *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) =
       *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) & 0xffffff4f | 0x80;
  *(undefined8 *)((long)&uStack_1a0 + *(long *)(local_1b0[0] + -0x18)) = 0x18;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"Number of Samples:",0x12)
  ;
  *(undefined8 *)((long)&uStack_1a0 + *(long *)(local_1b0[0] + -0x18)) = 0xc;
  std::ostream::operator<<((ostream *)local_1b0,iVar8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b0,"                                        #",0x29);
  cVar6 = (char)(ostream *)local_1b0;
  std::ios::widen((char)*(undefined8 *)(local_1b0[0] + -0x18) + cVar6);
  std::ostream::put(cVar6);
  std::ostream::flush();
  lVar12 = 0;
  local_38 = __return_storage_ptr__;
  do {
    iVar8 = (int)lVar12;
    if ((lVar12 != 0) &&
       ((1L << ((byte)lVar12 & 0x3f) & (this->statsMask_).super__Base_bitset<1UL>._M_w) != 0)) {
      pSVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar2 = pSVar1[lVar12].dataType._M_dataplus._M_p;
      local_350[0] = &local_340;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_350,pcVar2,pcVar2 + pSVar1[lVar12].dataType._M_string_length);
      iVar9 = std::__cxx11::string::compare((char *)local_350);
      if (local_350[0] != &local_340) {
        operator_delete(local_350[0],(long)local_340 + 1);
      }
      if (iVar9 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"# ",2);
        *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) =
             *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) & 0xffffff4f | 0x80;
        *(undefined8 *)((long)&uStack_1a0 + *(long *)(local_1b0[0] + -0x18)) = 0x17;
        pSVar1 = (this->data_).
                 super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_350[0] = &local_340;
        _Var3._M_p = pSVar1[lVar12].title._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_350,_Var3._M_p,_Var3._M_p + pSVar1[lVar12].title._M_string_length
                  );
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b0,(char *)local_350[0],(long)local_350[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,":",1);
        if (local_350[0] != &local_340) {
          operator_delete(local_350[0],(long)local_340 + 1);
        }
        *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) =
             *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) & 0xffffff4f | 0x80;
        *(undefined8 *)((long)&uStack_1a0 + *(long *)(local_1b0[0] + -0x18)) = 0xc;
        lVar15 = __dynamic_cast((this->data_).
                                super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar12].accumulator,
                                &BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
        std::ostream::_M_insert<double>(*(double *)(lVar15 + 0x18));
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b0,(char *)local_248,local_240);
        lVar15 = *(long *)poVar11;
        lVar13 = *(long *)(lVar15 + -0x18);
        *(uint *)(poVar11 + lVar13 + 0x18) = *(uint *)(poVar11 + lVar13 + 0x18) & 0xffffff4f | 0x20;
        *(undefined8 *)(poVar11 + *(long *)(lVar15 + -0x18) + 0x10) = 0xc;
        RVar5 = getRealError(this,iVar8);
        std::ostream::_M_insert<double>(RVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0," ",1);
        *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) =
             *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) & 0xffffff4f | 0x20;
        *(undefined8 *)((long)&uStack_1a0 + *(long *)(local_1b0[0] + -0x18)) = 0x11;
        pSVar1 = (this->data_).
                 super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_350[0] = &local_340;
        pcVar2 = pSVar1[lVar12].units._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_350,pcVar2,pcVar2 + pSVar1[lVar12].units._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b0,(char *)local_350[0],(long)local_350[1]);
        if (local_350[0] != &local_340) {
          operator_delete(local_350[0],(long)local_340 + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"     #",6);
        std::ios::widen((char)*(undefined8 *)(local_1b0[0] + -0x18) + cVar6);
        std::ostream::put(cVar6);
        std::ostream::flush();
      }
      else {
        pSVar1 = (this->data_).
                 super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar2 = pSVar1[lVar12].dataType._M_dataplus._M_p;
        local_350[0] = &local_340;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_350,pcVar2,pcVar2 + pSVar1[lVar12].dataType._M_string_length);
        iVar9 = std::__cxx11::string::compare((char *)local_350);
        if (local_350[0] != &local_340) {
          operator_delete(local_350[0],(long)local_340 + 1);
        }
        if (iVar9 == 0) {
          getVectorAverage((Vector3d *)&local_208,this,iVar8);
          local_378.super_Vector<double,_3U>.data_[0] = 0.0;
          local_378.super_Vector<double,_3U>.data_[1] = 0.0;
          local_378.super_Vector<double,_3U>.data_[2] = 0.0;
          this_01 = (VectorAccumulator *)
                    __dynamic_cast((this->data_).
                                   super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar12].accumulator,
                                   &BaseAccumulator::typeinfo,&VectorAccumulator::typeinfo,0);
          VectorAccumulator::get95percentConfidenceInterval(this_01,&local_378);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b0,"#                         ",0x1a);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,(char *)local_268,local_260);
          lVar15 = *(long *)poVar11;
          lVar13 = *(long *)(lVar15 + -0x18);
          *(uint *)(poVar11 + lVar13 + 0x18) =
               *(uint *)(poVar11 + lVar13 + 0x18) & 0xffffff4f | 0x80;
          *(undefined8 *)(poVar11 + *(long *)(lVar15 + -0x18) + 0x10) = 0xc;
          poVar11 = std::ostream::_M_insert<double>
                              (local_208.super_SquareMatrix<double,_3>.
                               super_RectMatrix<double,_3U,_3U>.data_[0][0]);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(char *)local_2c8,local_2c0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"     ",5);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,(char *)local_268,local_260);
          lVar15 = *(long *)poVar11;
          lVar13 = *(long *)(lVar15 + -0x18);
          *(uint *)(poVar11 + lVar13 + 0x18) =
               *(uint *)(poVar11 + lVar13 + 0x18) & 0xffffff4f | 0x80;
          *(undefined8 *)(poVar11 + *(long *)(lVar15 + -0x18) + 0x10) = 0xc;
          std::ostream::_M_insert<double>(local_378.super_Vector<double,_3U>.data_[0]);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,(char *)local_2c8,local_2c0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"                   #",0x14);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"# ",2);
          *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) =
               *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) & 0xffffff4f | 0x80;
          *(undefined8 *)((long)&uStack_1a0 + *(long *)(local_1b0[0] + -0x18)) = 0x17;
          pSVar1 = (this->data_).
                   super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_350[0] = &local_340;
          _Var3._M_p = pSVar1[lVar12].title._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_350,_Var3._M_p,
                     _Var3._M_p + pSVar1[lVar12].title._M_string_length);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,(char *)local_350[0],(long)local_350[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,":",1);
          if (local_350[0] != &local_340) {
            operator_delete(local_350[0],(long)local_340 + 1);
          }
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,(char *)local_288,local_280);
          lVar15 = *(long *)poVar11;
          lVar13 = *(long *)(lVar15 + -0x18);
          *(uint *)(poVar11 + lVar13 + 0x18) =
               *(uint *)(poVar11 + lVar13 + 0x18) & 0xffffff4f | 0x80;
          *(undefined8 *)(poVar11 + *(long *)(lVar15 + -0x18) + 0x10) = 0xc;
          poVar11 = std::ostream::_M_insert<double>
                              (local_208.super_SquareMatrix<double,_3>.
                               super_RectMatrix<double,_3U,_3U>.data_[0][1]);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(char *)local_2e8,local_2e0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_248,local_240);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,(char *)local_288,local_280);
          lVar15 = *(long *)poVar11;
          lVar13 = *(long *)(lVar15 + -0x18);
          *(uint *)(poVar11 + lVar13 + 0x18) =
               *(uint *)(poVar11 + lVar13 + 0x18) & 0xffffff4f | 0x80;
          *(undefined8 *)(poVar11 + *(long *)(lVar15 + -0x18) + 0x10) = 0xc;
          poVar11 = std::ostream::_M_insert<double>(local_378.super_Vector<double,_3U>.data_[1]);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(char *)local_2e8,local_2e0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
          *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) =
               *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) & 0xffffff4f | 0x20;
          *(undefined8 *)((long)&uStack_1a0 + *(long *)(local_1b0[0] + -0x18)) = 0x11;
          pSVar1 = (this->data_).
                   super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_350[0] = &local_340;
          pcVar2 = pSVar1[lVar12].units._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_350,pcVar2,pcVar2 + pSVar1[lVar12].units._M_string_length);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,(char *)local_350[0],(long)local_350[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," #",2);
          if (local_350[0] != &local_340) {
            operator_delete(local_350[0],(long)local_340 + 1);
          }
          std::ios::widen((char)*(undefined8 *)(local_1b0[0] + -0x18) + cVar6);
          std::ostream::put(cVar6);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b0,"#                         ",0x1a);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,(char *)local_2a8,local_2a0);
          lVar15 = *(long *)poVar11;
          lVar13 = *(long *)(lVar15 + -0x18);
          *(uint *)(poVar11 + lVar13 + 0x18) =
               *(uint *)(poVar11 + lVar13 + 0x18) & 0xffffff4f | 0x80;
          *(undefined8 *)(poVar11 + *(long *)(lVar15 + -0x18) + 0x10) = 0xc;
          poVar11 = std::ostream::_M_insert<double>
                              (local_208.super_SquareMatrix<double,_3>.
                               super_RectMatrix<double,_3U,_3U>.data_[0][2]);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(char *)local_308,local_300);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"     ",5);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,(char *)local_2a8,local_2a0);
          lVar15 = *(long *)poVar11;
          lVar13 = *(long *)(lVar15 + -0x18);
          *(uint *)(poVar11 + lVar13 + 0x18) =
               *(uint *)(poVar11 + lVar13 + 0x18) & 0xffffff4f | 0x80;
          *(undefined8 *)(poVar11 + *(long *)(lVar15 + -0x18) + 0x10) = 0xc;
          std::ostream::_M_insert<double>(local_378.super_Vector<double,_3U>.data_[2]);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,(char *)local_308,local_300);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"                   #",0x14);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
        }
        else {
          pSVar1 = (this->data_).
                   super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar2 = pSVar1[lVar12].dataType._M_dataplus._M_p;
          local_350[0] = &local_340;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_350,pcVar2,pcVar2 + pSVar1[lVar12].dataType._M_string_length);
          iVar9 = std::__cxx11::string::compare((char *)local_350);
          if (local_350[0] != &local_340) {
            operator_delete(local_350[0],(long)local_340 + 1);
          }
          if (iVar9 == 0) {
            getPotVecAverage((potVec *)local_350,this,iVar8);
            local_208.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] =
                 0.0;
            local_208.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] =
                 0.0;
            local_208.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] =
                 0.0;
            local_208.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] =
                 0.0;
            local_208.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
                 0.0;
            local_208.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] =
                 0.0;
            local_208.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] =
                 0.0;
            this_02 = (PotVecAccumulator *)
                      __dynamic_cast((this->data_).
                                     super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar12].accumulator,
                                     &BaseAccumulator::typeinfo,&PotVecAccumulator::typeinfo,0);
            PotVecAccumulator::get95percentConfidenceInterval(this_02,(ResultType *)&local_208);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"# ",2);
            *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) =
                 *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) & 0xffffff4f | 0x80;
            *(undefined8 *)((long)&uStack_1a0 + *(long *)(local_1b0[0] + -0x18)) = 0x17;
            pSVar1 = (this->data_).
                     super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_378.super_Vector<double,_3U>.data_[0] =
                 (double)(local_378.super_Vector<double,_3U>.data_ + 2);
            _Var3._M_p = pSVar1[lVar12].title._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_378,_Var3._M_p,
                       _Var3._M_p + pSVar1[lVar12].title._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,(char *)local_378.super_Vector<double,_3U>.data_[0],
                       (long)local_378.super_Vector<double,_3U>.data_[1]);
            if ((double *)local_378.super_Vector<double,_3U>.data_[0] !=
                local_378.super_Vector<double,_3U>.data_ + 2) {
              operator_delete((void *)local_378.super_Vector<double,_3U>.data_[0],
                              (long)local_378.super_Vector<double,_3U>.data_[2] + 1);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,":                                                    #"
                       ,0x36);
            std::ios::widen((char)*(undefined8 *)(local_1b0[0] + -0x18) + cVar6);
            std::ostream::put(cVar6);
            std::ostream::flush();
            lVar15 = 1;
            do {
              switch((int)lVar15) {
              case 1:
                lVar13 = 0xe;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"# ",2);
                pcVar14 = "van der Waals:";
                break;
              case 2:
                lVar13 = 0xe;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"# ",2);
                pcVar14 = "Electrostatic:";
                break;
              default:
                lVar13 = 8;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"# ",2);
                pcVar14 = "Unknown:";
                break;
              case 5:
                lVar13 = 0x11;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"# ",2);
                pcVar14 = "Hydrogen Bonding:";
                break;
              case 6:
                lVar13 = 0x15;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"# ",2);
                pcVar14 = "Bonded (1-2,1-3,1-4):";
              }
              *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) =
                   *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_1a0 + *(long *)(local_1b0[0] + -0x18)) = 0x18;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b0,pcVar14,lVar13);
              *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) =
                   *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_1a0 + *(long *)(local_1b0[0] + -0x18)) = 0xc;
              std::ostream::_M_insert<double>((double)local_350[lVar15]);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1b0,(char *)local_248,local_240);
              lVar13 = *(long *)poVar11;
              lVar4 = *(long *)(lVar13 + -0x18);
              *(uint *)(poVar11 + lVar4 + 0x18) =
                   *(uint *)(poVar11 + lVar4 + 0x18) & 0xffffff4f | 0x20;
              *(undefined8 *)(poVar11 + *(long *)(lVar13 + -0x18) + 0x10) = 0xc;
              std::ostream::_M_insert<double>
                        (local_208.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                         data_[0][lVar15]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0," ",1);
              *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) =
                   *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) & 0xffffff4f |
                   0x20;
              *(undefined8 *)((long)&uStack_1a0 + *(long *)(local_1b0[0] + -0x18)) = 0x11;
              pSVar1 = (this->data_).
                       super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_378.super_Vector<double,_3U>.data_[0] =
                   (double)(local_378.super_Vector<double,_3U>.data_ + 2);
              pcVar2 = pSVar1[lVar12].units._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_378,pcVar2,pcVar2 + pSVar1[lVar12].units._M_string_length)
              ;
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1b0,
                                   (char *)local_378.super_Vector<double,_3U>.data_[0],
                                   (long)local_378.super_Vector<double,_3U>.data_[1]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"     #",6);
              if ((double *)local_378.super_Vector<double,_3U>.data_[0] !=
                  local_378.super_Vector<double,_3U>.data_ + 2) {
                operator_delete((void *)local_378.super_Vector<double,_3U>.data_[0],
                                (long)local_378.super_Vector<double,_3U>.data_[2] + 1);
              }
              std::ios::widen((char)*(undefined8 *)(local_1b0[0] + -0x18) + cVar6);
              std::ostream::put(cVar6);
              std::ostream::flush();
              lVar15 = lVar15 + 1;
            } while (lVar15 != 7);
          }
          else {
            pSVar1 = (this->data_).
                     super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar2 = pSVar1[lVar12].dataType._M_dataplus._M_p;
            local_350[0] = &local_340;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_350,pcVar2,pcVar2 + pSVar1[lVar12].dataType._M_string_length)
            ;
            iVar9 = std::__cxx11::string::compare((char *)local_350);
            if (local_350[0] != &local_340) {
              operator_delete(local_350[0],(long)local_340 + 1);
            }
            if (iVar9 == 0) {
              getMatrixAverage((Mat3x3d *)local_350,this,iVar8);
              local_208.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] =
                   0.0;
              local_208.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] =
                   0.0;
              local_208.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] =
                   0.0;
              local_208.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] =
                   0.0;
              local_208.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] =
                   0.0;
              local_208.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] =
                   0.0;
              local_208.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
                   0.0;
              local_208.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] =
                   0.0;
              local_208.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] =
                   0.0;
              this_00 = (MatrixAccumulator *)
                        __dynamic_cast((this->data_).
                                       super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar12].accumulator
                                       ,&BaseAccumulator::typeinfo,&MatrixAccumulator::typeinfo,0);
              MatrixAccumulator::get95percentConfidenceInterval(this_00,&local_208);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b0,"#                         ",0x1a);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1b0,(char *)local_268,local_260);
              lVar15 = *(long *)poVar11;
              lVar13 = *(long *)(lVar15 + -0x18);
              *(uint *)(poVar11 + lVar13 + 0x18) =
                   *(uint *)(poVar11 + lVar13 + 0x18) & 0xffffff4f | 0x80;
              *(undefined8 *)(poVar11 + *(long *)(lVar15 + -0x18) + 0x10) = 0xc;
              poVar11 = std::ostream::_M_insert<double>((double)local_350[0]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
              *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) =
                   *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_1a0 + *(long *)(local_1b0[0] + -0x18)) = 0xc;
              poVar11 = std::ostream::_M_insert<double>((double)local_350[1]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
              *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) =
                   *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_1a0 + *(long *)(local_1b0[0] + -0x18)) = 0xc;
              poVar11 = std::ostream::_M_insert<double>(local_340);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(char *)local_2c8,local_2c0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"            #",0xd);
              std::ios::widen((char)*(undefined8 *)(local_1b0[0] + -0x18) + cVar6);
              std::ostream::put(cVar6);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"# ",2);
              *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) =
                   *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_1a0 + *(long *)(local_1b0[0] + -0x18)) = 0x17;
              pSVar1 = (this->data_).
                       super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_378.super_Vector<double,_3U>.data_[0] =
                   (double)(local_378.super_Vector<double,_3U>.data_ + 2);
              _Var3._M_p = pSVar1[lVar12].title._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_378,_Var3._M_p,
                         _Var3._M_p + pSVar1[lVar12].title._M_string_length);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1b0,
                                   (char *)local_378.super_Vector<double,_3U>.data_[0],
                                   (long)local_378.super_Vector<double,_3U>.data_[1]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,":",1);
              if ((double *)local_378.super_Vector<double,_3U>.data_[0] !=
                  local_378.super_Vector<double,_3U>.data_ + 2) {
                operator_delete((void *)local_378.super_Vector<double,_3U>.data_[0],
                                (long)local_378.super_Vector<double,_3U>.data_[2] + 1);
              }
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1b0,(char *)local_288,local_280);
              lVar15 = *(long *)poVar11;
              lVar13 = *(long *)(lVar15 + -0x18);
              *(uint *)(poVar11 + lVar13 + 0x18) =
                   *(uint *)(poVar11 + lVar13 + 0x18) & 0xffffff4f | 0x80;
              *(undefined8 *)(poVar11 + *(long *)(lVar15 + -0x18) + 0x10) = 0xc;
              poVar11 = std::ostream::_M_insert<double>(local_338);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
              *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) =
                   *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_1a0 + *(long *)(local_1b0[0] + -0x18)) = 0xc;
              poVar11 = std::ostream::_M_insert<double>(local_330);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
              *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) =
                   *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_1a0 + *(long *)(local_1b0[0] + -0x18)) = 0xc;
              poVar11 = std::ostream::_M_insert<double>(local_328);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(char *)local_2e8,local_2e0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
              *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) =
                   *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) & 0xffffff4f |
                   0x20;
              *(undefined8 *)((long)&uStack_1a0 + *(long *)(local_1b0[0] + -0x18)) = 0xb;
              pSVar1 = (this->data_).
                       super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_378.super_Vector<double,_3U>.data_[0] =
                   (double)(local_378.super_Vector<double,_3U>.data_ + 2);
              pcVar2 = pSVar1[lVar12].units._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_378,pcVar2,pcVar2 + pSVar1[lVar12].units._M_string_length)
              ;
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1b0,
                                   (char *)local_378.super_Vector<double,_3U>.data_[0],
                                   (long)local_378.super_Vector<double,_3U>.data_[1]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"#",1);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
              std::ostream::put((char)poVar11);
              std::ostream::flush();
              if ((double *)local_378.super_Vector<double,_3U>.data_[0] !=
                  local_378.super_Vector<double,_3U>.data_ + 2) {
                operator_delete((void *)local_378.super_Vector<double,_3U>.data_[0],
                                (long)local_378.super_Vector<double,_3U>.data_[2] + 1);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b0,"#                         ",0x1a);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1b0,(char *)local_2a8,local_2a0);
              lVar15 = *(long *)poVar11;
              lVar13 = *(long *)(lVar15 + -0x18);
              *(uint *)(poVar11 + lVar13 + 0x18) =
                   *(uint *)(poVar11 + lVar13 + 0x18) & 0xffffff4f | 0x80;
              *(undefined8 *)(poVar11 + *(long *)(lVar15 + -0x18) + 0x10) = 0xc;
              poVar11 = std::ostream::_M_insert<double>(local_320);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
              *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) =
                   *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_1a0 + *(long *)(local_1b0[0] + -0x18)) = 0xc;
              poVar11 = std::ostream::_M_insert<double>(local_318);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
              *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) =
                   *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_1a0 + *(long *)(local_1b0[0] + -0x18)) = 0xc;
              poVar11 = std::ostream::_M_insert<double>(local_310);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(char *)local_308,local_300);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"            #",0xd);
              std::ios::widen((char)*(undefined8 *)(local_1b0[0] + -0x18) + cVar6);
              std::ostream::put(cVar6);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b0,"#                                 ",0x22);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1b0,(char *)local_268,local_260);
              lVar15 = *(long *)poVar11;
              lVar13 = *(long *)(lVar15 + -0x18);
              *(uint *)(poVar11 + lVar13 + 0x18) =
                   *(uint *)(poVar11 + lVar13 + 0x18) & 0xffffff4f | 0x80;
              *(undefined8 *)(poVar11 + *(long *)(lVar15 + -0x18) + 0x10) = 0xc;
              poVar11 = std::ostream::_M_insert<double>
                                  (local_208.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[0][0]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
              *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) =
                   *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_1a0 + *(long *)(local_1b0[0] + -0x18)) = 0xc;
              poVar11 = std::ostream::_M_insert<double>
                                  (local_208.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[0][1]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
              *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) =
                   *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_1a0 + *(long *)(local_1b0[0] + -0x18)) = 0xc;
              poVar11 = std::ostream::_M_insert<double>
                                  (local_208.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[0][2]);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(char *)local_2c8,local_2c0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"    #",5);
              std::ios::widen((char)*(undefined8 *)(local_1b0[0] + -0x18) + cVar6);
              std::ostream::put(cVar6);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b0,"#                            ",0x1d);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b0,(char *)local_248,local_240);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1b0,(char *)local_288,local_280);
              lVar15 = *(long *)poVar11;
              lVar13 = *(long *)(lVar15 + -0x18);
              *(uint *)(poVar11 + lVar13 + 0x18) =
                   *(uint *)(poVar11 + lVar13 + 0x18) & 0xffffff4f | 0x80;
              *(undefined8 *)(poVar11 + *(long *)(lVar15 + -0x18) + 0x10) = 0xc;
              poVar11 = std::ostream::_M_insert<double>
                                  (local_208.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[1][0]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
              *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) =
                   *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_1a0 + *(long *)(local_1b0[0] + -0x18)) = 0xc;
              poVar11 = std::ostream::_M_insert<double>
                                  (local_208.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[1][1]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
              *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) =
                   *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_1a0 + *(long *)(local_1b0[0] + -0x18)) = 0xc;
              poVar11 = std::ostream::_M_insert<double>
                                  (local_208.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[1][2]);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(char *)local_2e8,local_2e0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"    #",5);
              std::ios::widen((char)*(undefined8 *)(local_1b0[0] + -0x18) + cVar6);
              std::ostream::put(cVar6);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b0,"#                                 ",0x22);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1b0,(char *)local_2a8,local_2a0);
              lVar15 = *(long *)poVar11;
              lVar13 = *(long *)(lVar15 + -0x18);
              *(uint *)(poVar11 + lVar13 + 0x18) =
                   *(uint *)(poVar11 + lVar13 + 0x18) & 0xffffff4f | 0x80;
              *(undefined8 *)(poVar11 + *(long *)(lVar15 + -0x18) + 0x10) = 0xc;
              poVar11 = std::ostream::_M_insert<double>
                                  (local_208.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[2][0]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
              *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) =
                   *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_1a0 + *(long *)(local_1b0[0] + -0x18)) = 0xc;
              poVar11 = std::ostream::_M_insert<double>
                                  (local_208.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[2][1]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
              *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) =
                   *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_1a0 + *(long *)(local_1b0[0] + -0x18)) = 0xc;
              poVar11 = std::ostream::_M_insert<double>
                                  (local_208.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[2][2]);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(char *)local_308,local_300);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"    #",5);
              std::ios::widen((char)*(undefined8 *)(local_1b0[0] + -0x18) + cVar6);
              std::ostream::put(cVar6);
              std::ostream::flush();
            }
          }
        }
      }
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x2e);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,(char *)local_228,local_220);
  psVar7 = local_38;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  if (local_228 != local_218) {
    operator_delete(local_228,local_218[0] + 1);
  }
  if (local_308 != local_2f8) {
    operator_delete(local_308,local_2f8[0] + 1);
  }
  if (local_2e8 != local_2d8) {
    operator_delete(local_2e8,local_2d8[0] + 1);
  }
  if (local_2c8 != local_2b8) {
    operator_delete(local_2c8,local_2b8[0] + 1);
  }
  if (local_2a8 != local_298) {
    operator_delete(local_2a8,local_298[0] + 1);
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  if (local_268 != local_258) {
    operator_delete(local_268,local_258[0] + 1);
  }
  if (local_248 != local_238) {
    operator_delete(local_248,local_238[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1c0);
  std::ios_base::~ios_base(local_140);
  return psVar7;
}

Assistant:

std::string Stats::getStatsReport() {
    std::stringstream report;
#if defined(_MSC_VER)
    std::string pm  = " +/- ";
    std::string luc = "[";
    std::string lex = "|";
    std::string llc = "[";
    std::string ruc = "]";
    std::string rex = "|";
    std::string rlc = "]";
#else
    std::string pm  = "  \u00B1  ";
    std::string luc = "\u23A1";
    std::string lex = "\u23A2";
    std::string llc = "\u23A3";
    std::string ruc = "\u23A4";
    std::string rex = "\u23A5";
    std::string rlc = "\u23A6";
#endif

    int nSamp = dynamic_cast<Accumulator*>(data_[TIME].accumulator)->count();

    std::string head(79, '#');
    report << head << std::endl;
    report << "# Status Report:" << std::string(62, ' ') << "#" << std::endl;
    report << "# " << right << setw(24) << "Total Time:";
    report << setw(12) << getRealData(TIME);
    report << " " << setw(17) << left << getUnits(TIME)
           << "                      #" << std::endl;
    report << "# " << right << setw(24) << "Number of Samples:";
    report << setw(12) << nSamp;
    report << "                                        #" << std::endl;

    for (unsigned int i = 0; i < statsMask_.size(); ++i) {
      if (statsMask_[i] && i != TIME) {
        if (getDataType(i) == "RealType") {
          report << "# " << right << setw(23) << getTitle(i) << ":";
          report << right << setw(12) << getRealAverage(i);
          report << pm << left << setw(12) << getRealError(i);
          report << " " << left << setw(17) << getUnits(i);
          report << "     #" << std::endl;

        } else if (getDataType(i) == "Vector3d") {
          Vector3d s = getVectorAverage(i);
          Vector3d e = getVectorError(i);

          report << "#                         ";
          report << luc << right << setw(12) << s(0) << ruc << "     ";
          report << luc << right << setw(12) << e(0);
          report << ruc << "                   #" << std::endl;

          report << "# " << right << setw(23) << getTitle(i) << ":";

          report << lex << right << setw(12) << s(1) << rex << pm;
          report << lex << right << setw(12) << e(1) << rex << " ";
          report << left << setw(17) << getUnits(i) << " #";
          report << std::endl;

          report << "#                         ";
          report << llc << right << setw(12) << s(2) << rlc << "     ";
          report << llc << right << setw(12) << e(2);
          report << rlc << "                   #" << std::endl;

        } else if (getDataType(i) == "potVec") {
          potVec s = getPotVecAverage(i);
          potVec e = getPotVecError(i);

          report << "# " << right << setw(23) << getTitle(i);
          report << ":                                                    #";
          report << std::endl;

          for (unsigned int j = 1; j < N_INTERACTION_FAMILIES; j++) {
            switch (j) {
            case VANDERWAALS_FAMILY:
              report << "# " << right << setw(24) << "van der Waals:";
              break;
            case ELECTROSTATIC_FAMILY:
              report << "# " << right << setw(24) << "Electrostatic:";
              break;
            case METALLIC_EMBEDDING:
              report << "# " << right << setw(24) << "Metallic Embedding:";
              break;
            case METALLIC_PAIR:
              report << "# " << right << setw(24) << "Metallic Pair:";
              break;
            case HYDROGENBONDING_FAMILY:
              report << "# " << right << setw(24) << "Hydrogen Bonding:";
              break;
            case BONDED_FAMILY:
              report << "# " << right << setw(24) << "Bonded (1-2,1-3,1-4):";
              break;
            default:
              report << "# " << right << setw(24) << "Unknown:";
              break;
            }
            report << right << setw(12) << s[j];
            report << pm << left << setw(12) << e[j];
            report << " " << left << setw(17) << getUnits(i) << "     #";
            report << std::endl;
          }

        } else if (getDataType(i) == "Mat3x3d") {
          Mat3x3d s = getMatrixAverage(i);
          Mat3x3d e = getMatrixError(i);

          report << "#                         ";
          report << luc << right << setw(12) << s(0, 0) << " ";
          report << right << setw(12) << s(0, 1) << " ";
          report << right << setw(12) << s(0, 2) << ruc << "            #";
          report << std::endl;

          report << "# " << right << setw(23) << getTitle(i) << ":";

          report << lex << right << setw(12) << s(1, 0) << " ";
          report << right << setw(12) << s(1, 1) << " ";
          report << right << setw(12) << s(1, 2) << rex << " ";
          report << left << setw(11) << getUnits(i) << "#" << std::endl;

          report << "#                         ";
          report << llc << right << setw(12) << s(2, 0) << " ";
          report << right << setw(12) << s(2, 1) << " ";
          report << right << setw(12) << s(2, 2) << rlc << "            #";
          report << std::endl;

          report << "#                                 ";
          report << luc << right << setw(12) << e(0, 0) << " ";
          report << right << setw(12) << e(0, 1) << " ";
          report << right << setw(12) << e(0, 2) << ruc << "    #";
          report << std::endl;

          report << "#                            " << pm;

          report << lex << right << setw(12) << e(1, 0) << " ";
          report << right << setw(12) << e(1, 1) << " ";
          report << right << setw(12) << e(1, 2) << rex << "    #";
          report << std::endl;

          report << "#                                 ";
          report << llc << right << setw(12) << e(2, 0) << " ";
          report << right << setw(12) << e(2, 1) << " ";
          report << right << setw(12) << e(2, 2) << rlc << "    #";
          report << std::endl;
        }
      }
    }
    report << head << std::endl;

    return report.str();
  }